

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lossless_enc.c
# Opt level: O0

void GetCombinedEntropyUnrefined_C
               (uint32_t *X,uint32_t *Y,int length,VP8LBitEntropy *bit_entropy,VP8LStreaks *stats)

{
  int iVar1;
  int iVar2;
  VP8LBitEntropy *in_RCX;
  int in_EDX;
  int *in_RSI;
  int *in_RDI;
  VP8LBitEntropy *in_R8;
  float fVar3;
  uint32_t xy;
  uint32_t xy_prev;
  int i_prev;
  int i;
  undefined4 uVar4;
  int iVar5;
  undefined4 in_stack_ffffffffffffffe8;
  uint32_t val;
  
  uVar4 = 0;
  iVar1 = *in_RDI;
  iVar2 = *in_RSI;
  memset(in_R8,0,0x18);
  VP8LBitEntropyInit(in_RCX);
  for (iVar5 = 1; val = (uint32_t)((ulong)in_RSI >> 0x20), iVar5 < in_EDX; iVar5 = iVar5 + 1) {
    if (in_RDI[iVar5] + in_RSI[iVar5] != iVar1 + iVar2) {
      GetEntropyUnrefinedHelper
                (val,(int)in_RSI,(uint32_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),
                 (int *)in_RCX,in_R8,(VP8LStreaks *)CONCAT44(iVar5,uVar4));
    }
  }
  GetEntropyUnrefinedHelper
            (val,(int)in_RSI,(uint32_t *)CONCAT44(in_EDX,in_stack_ffffffffffffffe8),(int *)in_RCX,
             in_R8,(VP8LStreaks *)CONCAT44(iVar5,uVar4));
  fVar3 = VP8LFastSLog2(0);
  in_RCX->entropy = (double)fVar3 + in_RCX->entropy;
  return;
}

Assistant:

static void GetCombinedEntropyUnrefined_C(const uint32_t X[],
                                          const uint32_t Y[],
                                          int length,
                                          VP8LBitEntropy* const bit_entropy,
                                          VP8LStreaks* const stats) {
  int i = 1;
  int i_prev = 0;
  uint32_t xy_prev = X[0] + Y[0];

  memset(stats, 0, sizeof(*stats));
  VP8LBitEntropyInit(bit_entropy);

  for (i = 1; i < length; ++i) {
    const uint32_t xy = X[i] + Y[i];
    if (xy != xy_prev) {
      GetEntropyUnrefinedHelper(xy, i, &xy_prev, &i_prev, bit_entropy, stats);
    }
  }
  GetEntropyUnrefinedHelper(0, i, &xy_prev, &i_prev, bit_entropy, stats);

  bit_entropy->entropy += VP8LFastSLog2(bit_entropy->sum);
}